

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::create_torrent::set_hash(create_torrent *this,piece_index_t index,sha1_hash *h)

{
  sha1_hash *psVar1;
  bool bVar2;
  value_type *pvVar3;
  error_code_enum local_24;
  sha1_hash *local_20;
  sha1_hash *h_local;
  create_torrent *this_local;
  piece_index_t index_local;
  
  local_20 = h;
  h_local = (sha1_hash *)this;
  this_local._4_4_ = index.m_val;
  if (((byte)this->field_0x258 >> 4 & 1) == 0) {
    bVar2 = ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ::empty(&(this->m_piece_hash).
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                   );
    if (bVar2) {
      libtorrent::aux::
      container_wrapper<libtorrent::digest32<160l>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>>
      ::resize<int,void>((container_wrapper<libtorrent::digest32<160l>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>>
                          *)&this->m_piece_hash,this->m_num_pieces);
    }
    psVar1 = local_20;
    pvVar3 = libtorrent::aux::
             container_wrapper<libtorrent::digest32<160L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
             ::operator[](&this->m_piece_hash,
                          (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
                          this_local._4_4_);
    *(undefined8 *)(pvVar3->m_number)._M_elems = *(undefined8 *)(psVar1->m_number)._M_elems;
    *(undefined8 *)((pvVar3->m_number)._M_elems + 2) =
         *(undefined8 *)((psVar1->m_number)._M_elems + 2);
    (pvVar3->m_number)._M_elems[4] = (psVar1->m_number)._M_elems[4];
    return;
  }
  local_24 = invalid_hash_entry;
  libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            (&local_24);
}

Assistant:

void create_torrent::set_hash(piece_index_t index, sha1_hash const& h)
	{
		if (m_v2_only)
			aux::throw_ex<system_error>(errors::invalid_hash_entry);

		if (m_piece_hash.empty())
			m_piece_hash.resize(m_num_pieces);

		TORRENT_ASSERT_PRECOND(index >= piece_index_t(0));
		TORRENT_ASSERT_PRECOND(index < m_piece_hash.end_index());
		m_piece_hash[index] = h;
	}